

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int verify_certificate(ptls_verify_certificate_t *_self,ptls_t *tls,
                      _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
                      ptls_iovec_t *certs,size_t num_certs)

{
  bool bVar1;
  int iVar2;
  X509 *x509;
  X509 *pXVar3;
  X509_STORE_CTX *ctx;
  EVP_PKEY *pEVar4;
  long lVar5;
  int iVar6;
  size_t *psVar7;
  uint8_t *p;
  uint8_t *local_48;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **local_40;
  void **local_38;
  
  local_38 = verify_data;
  if (num_certs == 0) {
    __assert_fail("num_certs != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/openssl.c"
                  ,0x2fd,
                  "int verify_certificate(ptls_verify_certificate_t *, ptls_t *, int (**)(void *, ptls_iovec_t, ptls_iovec_t), void **, ptls_iovec_t *, size_t)"
                 );
  }
  local_48 = certs->base;
  iVar6 = 0;
  x509 = d2i_X509((X509 **)0x0,&local_48,certs->len);
  iVar2 = 0x2a;
  if (x509 == (X509 *)0x0) {
    ctx = (X509_STORE_CTX *)0x0;
  }
  else {
    local_40 = verifier;
    if (_self[1].cb ==
        (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
         *)0x0) {
      ctx = (X509_STORE_CTX *)0x0;
    }
    else {
      if (num_certs != 1) {
        lVar5 = num_certs - 1;
        psVar7 = &certs[1].len;
        do {
          local_48 = ((ptls_iovec_t *)(psVar7 + -1))->base;
          pXVar3 = d2i_X509((X509 **)0x0,&local_48,*psVar7);
          if (pXVar3 == (X509 *)0x0) {
            iVar6 = 0x2a;
            goto LAB_00104d46;
          }
          psVar7 = psVar7 + 2;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      ctx = X509_STORE_CTX_new();
      iVar6 = 0x201;
      if (ctx == (X509_STORE_CTX *)0x0) {
LAB_00104d46:
        ctx = (X509_STORE_CTX *)0x0;
        bVar1 = false;
      }
      else {
        bVar1 = false;
        iVar2 = X509_STORE_CTX_init(ctx,(X509_STORE *)_self[1].cb,x509,(stack_st_X509 *)0x0);
        if (iVar2 == 1) {
          X509_STORE_CTX_set_purpose(ctx,1);
          iVar2 = X509_verify_cert(ctx);
          bVar1 = true;
          if (iVar2 == 1) {
            iVar6 = 0;
          }
          else {
            iVar2 = X509_STORE_CTX_get_error(ctx);
            if (iVar2 == 10) {
              iVar6 = 0x2d;
            }
            else if (iVar2 != 0x11) {
              if (iVar2 == 0x17) {
                iVar6 = 0x2c;
              }
              else {
                iVar6 = 0x2e;
              }
            }
            bVar1 = false;
          }
        }
        else {
          iVar6 = 0x203;
        }
      }
      iVar2 = iVar6;
      if (!bVar1) goto LAB_00104dbe;
    }
    pEVar4 = X509_get_pubkey(x509);
    *local_38 = pEVar4;
    if (pEVar4 == (EVP_PKEY *)0x0) {
      iVar2 = 0x2a;
    }
    else {
      *local_40 = verify_sign;
      iVar2 = iVar6;
    }
  }
LAB_00104dbe:
  if (ctx != (X509_STORE_CTX *)0x0) {
    X509_STORE_CTX_free(ctx);
  }
  if (x509 != (X509 *)0x0) {
    X509_free(x509);
  }
  return iVar2;
}

Assistant:

static int verify_certificate(ptls_verify_certificate_t *_self, ptls_t *tls, int (**verifier)(void *, ptls_iovec_t, ptls_iovec_t),
                              void **verify_data, ptls_iovec_t *certs, size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = NULL;
    X509_STORE_CTX *verify_ctx = NULL;
    int ret = 0;

    assert(num_certs != 0);

    if ((cert = to_x509(certs[0])) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }

    if (self->cert_store != NULL) {
        size_t i;
        for (i = 1; i != num_certs; ++i) {
            X509 *interm = to_x509(certs[i]);
            if (interm == NULL) {
                ret = PTLS_ALERT_BAD_CERTIFICATE;
                goto Exit;
            }
        }
        if ((verify_ctx = X509_STORE_CTX_new()) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (X509_STORE_CTX_init(verify_ctx, self->cert_store, cert, chain) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        X509_STORE_CTX_set_purpose(verify_ctx, X509_PURPOSE_SSL_CLIENT);
        if (X509_verify_cert(verify_ctx) == 1) {
            ret = 0;
        } else {
            switch (X509_STORE_CTX_get_error(verify_ctx)) {
            case X509_V_ERR_OUT_OF_MEM:
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            case X509_V_ERR_CERT_REVOKED:
                ret = PTLS_ALERT_CERTIFICATE_REVOKED;
                goto Exit;
            case X509_V_ERR_CERT_HAS_EXPIRED:
                ret = PTLS_ALERT_CERTIFICATE_EXPIRED;
                goto Exit;
            default:
                ret = PTLS_ALERT_CERTIFICATE_UNKNOWN;
                goto Exit;
            }
        }
    }

    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (verify_ctx != NULL)
        X509_STORE_CTX_free(verify_ctx);
    if (chain != NULL)
        sk_X509_free(chain);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}